

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

int * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::get_payload
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *__a;
  int *piVar4;
  int *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  double dVar5;
  double dVar6;
  int idx;
  data_node_type *leaf;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  value_type *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  int *local_88;
  int local_54 [3];
  double local_48;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_40;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar7;
  undefined1 left;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_01;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_8;
  
  in_RDI->contraction_threshold_ = (double)((long)in_RDI->contraction_threshold_ + 1);
  iVar3 = *in_RSI;
  this_01 = (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0;
  local_8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)(((_Vector_impl *)&(in_RDI->super_AlexNode<int,_int>)._vptr_AlexNode)->
               super__Vector_impl_data)._M_start;
  this_00 = in_RDI;
  if (((local_8->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0) {
    do {
      local_40 = local_8;
      local_48 = LinearModel<int>::predict_double
                           (&(local_40->super_AlexNode<int,_int>).model_,iVar3);
      local_54[2] = (int)local_48;
      local_54[1] = 0;
      __a = std::max<int>(local_54 + 2,local_54 + 1);
      local_54[0] = *(int *)&local_40->allocator_ + -1;
      piVar4 = std::min<int>(__a,local_54);
      iVar2 = (int)__a;
      local_54[2] = *piVar4;
      if (this_01 !=
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0) {
        iVar2 = (int)this_01;
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)in_RDI,in_stack_ffffffffffffff48);
      }
      local_8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(local_40->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_54[2]];
    } while (((local_8->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0);
    in_RDI->expansion_threshold_ =
         (double)((long)in_RDI->expansion_threshold_ +
                 (long)(local_8->super_AlexNode<int,_int>).level_);
    dVar1 = local_48 + 0.5;
    pAVar7 = local_8;
    dVar5 = std::numeric_limits<double>::epsilon();
    left = (undefined1)((ulong)pAVar7 >> 0x38);
    dVar5 = dVar5 * 10.0 * local_48;
    dVar6 = local_48 - (double)(int)dVar1;
    std::abs(iVar2);
    if (dVar6 <= dVar5) {
      if (local_48 < (double)(int)dVar1) {
        if ((local_8->next_leaf_ != (self_type *)0x0) &&
           (iVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    ::first_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
           iVar2 <= iVar3)) {
          if (this_01 !=
              (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0)
          {
            correct_traversal_path
                      (this_01,(data_node_type *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,(bool)left);
          }
          local_8 = local_8->next_leaf_;
        }
      }
      else if ((local_8->prev_leaf_ != (self_type *)0x0) &&
              (iVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       ::last_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                   *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
              iVar3 <= iVar2)) {
        if (this_01 !=
            (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0) {
          correct_traversal_path
                    (this_01,(data_node_type *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd0,(bool)left);
        }
        local_8 = local_8->prev_leaf_;
      }
    }
  }
  iVar3 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(this_00,in_RSI);
  if (iVar3 < 0) {
    local_88 = (int *)0x0;
  }
  else {
    local_88 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::get_payload(local_8,iVar3);
  }
  return local_88;
}

Assistant:

P* get_payload(const T& key) const {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return nullptr;
    } else {
      return &(leaf->get_payload(idx));
    }
  }